

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O2

int __thiscall MovDemuxer::mov_read_udta_string(MovDemuxer *this,MOVAtom atom)

{
  uint16_t uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  int iVar7;
  long lStack_460;
  allocator<char> local_451;
  char key [4];
  char local_44c [4];
  key_type local_448;
  char str [1024];
  
  iVar7 = 0;
  memset(str,0,0x400);
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  if (this->itunes_metadata == 0) {
    uVar1 = IOContextDemuxer::get_be16(&this->super_IOContextDemuxer);
    uVar3 = (uint)uVar1;
    uVar1 = IOContextDemuxer::get_be16(&this->super_IOContextDemuxer);
    ff_mov_lang_to_iso639((uint)uVar1,local_44c);
    lStack_460 = -4;
  }
  else {
    uVar3 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    uVar4 = IOContextDemuxer::get_le32(&this->super_IOContextDemuxer);
    if (uVar4 != 0x61746164) {
      return 0;
    }
    IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    uVar3 = uVar3 - 0x10;
    lStack_460 = -0x10;
  }
  uVar5 = lStack_460 + atom.size;
  if ((long)uVar5 < 0) {
    iVar7 = -1;
  }
  else {
    key._0_3_ = atom.type._1_3_;
    uVar4 = 0x3ff;
    if (uVar3 < 0x3ff) {
      uVar4 = uVar3;
    }
    uVar2 = (ushort)uVar5;
    if (uVar4 <= uVar5) {
      uVar2 = (ushort)uVar4;
    }
    IOContextDemuxer::get_buffer(&this->super_IOContextDemuxer,(uint8_t *)str,(uint)uVar2);
    str[uVar2] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,key,&local_451);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->metaData,&local_448);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&local_448);
  }
  return iVar7;
}

Assistant:

int MovDemuxer::mov_read_udta_string(MOVAtom atom)
{
    char str[1024]{}, key[4]{0}, language[4]{0};
    unsigned str_size;

    if (itunes_metadata)
    {
        const unsigned data_size = get_be32();
        const unsigned tag = get_le32();
        if (tag == MKTAG('d', 'a', 't', 'a'))
        {
            get_be32();  // type
            get_be32();  // unknown
            str_size = data_size - 16;
            atom.size -= 16;
        }
        else
            return 0;
    }
    else
    {
        str_size = get_be16();  // string length
        ff_mov_lang_to_iso639(get_be16(), language);
        atom.size -= 4;
    }
    if (atom.size < 0)
        return -1;

    key[0] = static_cast<char>(atom.type >> 8);
    key[1] = static_cast<char>(atom.type >> 16);
    key[2] = static_cast<char>(atom.type >> 24);

    str_size = static_cast<uint16_t>(FFMIN(FFMIN((int)(sizeof(str) - 1), str_size), atom.size));
    get_buffer(reinterpret_cast<uint8_t*>(str), str_size);
    str[str_size] = 0;
    metaData[key] = str;
    return 0;
}